

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O1

void duckdb::StructStats::Merge(BaseStatistics *stats,BaseStatistics *other)

{
  idx_t iVar1;
  long lVar2;
  
  if (((other->type).id_ != VALIDITY) &&
     (iVar1 = StructType::GetChildCount(&stats->type), iVar1 != 0)) {
    lVar2 = 0;
    do {
      BaseStatistics::Merge
                ((BaseStatistics *)
                 ((long)&((stats->child_stats).
                          super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
                          .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl)->
                         type + lVar2),
                 (BaseStatistics *)
                 ((long)&((other->child_stats).
                          super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
                          .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl)->
                         type + lVar2));
      lVar2 = lVar2 + 0x58;
      iVar1 = iVar1 - 1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void StructStats::Merge(BaseStatistics &stats, const BaseStatistics &other) {
	if (other.GetType().id() == LogicalTypeId::VALIDITY) {
		return;
	}
	D_ASSERT(stats.GetType().id() == other.GetType().id());
	D_ASSERT(StructType::GetChildCount(stats.GetType()) == StructType::GetChildCount(other.GetType()));
	auto child_count = StructType::GetChildCount(stats.GetType());
	for (idx_t i = 0; i < child_count; i++) {
		stats.child_stats[i].Merge(other.child_stats[i]);
	}
}